

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,Track *pTrack,longlong time_ns)

{
  BlockEntry *pBVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  BlockEntry *pBVar4;
  BlockEntry *pBVar5;
  long lVar6;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  Block *this_00;
  
  if (this->m_pSegment == (Segment *)0x0) {
    return &(pTrack->m_eos).super_BlockEntry;
  }
  lVar6 = 0;
  pBVar5 = &(pTrack->m_eos).super_BlockEntry;
  do {
    if (this->m_entries_count <= lVar6) {
      lVar3 = Parse(this,&local_38,&local_40);
      if (0 < lVar3) {
        return pBVar5;
      }
      if (lVar3 != 0) {
        return (BlockEntry *)0x0;
      }
    }
    pBVar1 = this->m_entries[lVar6];
    iVar2 = (*pBVar1->_vptr_BlockEntry[2])(pBVar1);
    this_00 = (Block *)CONCAT44(extraout_var,iVar2);
    pBVar4 = pBVar5;
    if (this_00->m_track == (pTrack->m_info).number) {
      iVar2 = (*pTrack->_vptr_Track[2])(pTrack,pBVar1);
      if ((char)iVar2 == '\0') {
        if (time_ns < 0) goto LAB_0015a6d7;
        lVar3 = Block::GetTime(this_00,this);
        pBVar1 = pBVar5;
      }
      else {
        if (time_ns < 0) {
          return pBVar1;
        }
        lVar3 = Block::GetTime(this_00,this);
      }
      pBVar4 = pBVar1;
      if (time_ns < lVar3) {
        return pBVar5;
      }
    }
LAB_0015a6d7:
    lVar6 = lVar6 + 1;
    pBVar5 = pBVar4;
  } while( true );
}

Assistant:

const BlockEntry* Track::GetEOS() const { return &m_eos; }